

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmCpGen<(moira::Instr)149,(moira::Mode)12,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  char cVar6;
  
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    dasmIllegal<(moira::Instr)149,(moira::Mode)12,0>(this,str,addr,op);
    return;
  }
  *addr = *addr + 2;
  iVar2 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  uVar3 = (*this->_vptr_Moira[6])(this);
  s = &str->ptr;
  sprintd_signed(s,(ulong)(op >> 9 & 7));
  cVar6 = 'g';
  lVar4 = 1;
  do {
    pcVar5 = *s;
    *s = pcVar5 + 1;
    *pcVar5 = cVar6;
    cVar6 = "gen"[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar5 = *s;
    *s = pcVar5 + 1;
    *pcVar5 = ' ';
    pcVar5 = *s;
  }
  else {
    iVar1 = (str->tab).raw;
    pcVar5 = str->ptr;
    do {
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    } while (pcVar5 < str->base + iVar1);
  }
  str->ptr = pcVar5 + 1;
  *pcVar5 = '#';
  StrWriter::operator<<(str,(UInt)(iVar2 << 0x10 | uVar3 & 0xffff));
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar6 = ';';
    lVar4 = 1;
    do {
      pcVar5 = *s;
      *s = pcVar5 + 1;
      *pcVar5 = cVar6;
      cVar6 = "%dgen    %s; (2-3)"[lVar4 + 0xb];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
  }
  return;
}

Assistant:

void
Moira::dasmCpGen(StrWriter &str, u32 &addr, u16 op) const
{
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    auto id  = ( ____xxx_________(op) );
    auto ext = Imu ( dasmIncRead<Long>(addr) );

    str << id << Ins<I>{} << str.tab << ext;
    str << Av<I, M, S>{};
}